

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapValueRef::SetInt32Value(MapValueRef *this,int32_t value)

{
  CppType CVar1;
  LogMessage *pLVar2;
  char *local_48;
  char *local_40 [3];
  LogMessageFatal local_28 [19];
  Voidify local_15;
  int32_t local_14;
  MapValueRef *pMStack_10;
  int32_t value_local;
  MapValueRef *this_local;
  
  local_14 = value;
  pMStack_10 = this;
  CVar1 = MapValueConstRef::type(&this->super_MapValueConstRef);
  if (CVar1 != CPPTYPE_INT32) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map_field.h"
               ,0x34a);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [34])"Protocol Buffer map usage error:\n");
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [27])"MapValueRef::SetInt32Value");
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [22])" type does not match\n");
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [14])"  Expected : ");
    local_40[0] = FieldDescriptor::CppTypeName(CPPTYPE_INT32);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>
                       (pLVar2,local_40);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(char (*) [2])0x603aea)
    ;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [14])"  Actual   : ");
    CVar1 = MapValueConstRef::type(&this->super_MapValueConstRef);
    local_48 = FieldDescriptor::CppTypeName(CVar1);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>
                       (pLVar2,&local_48);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_15,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
  }
  *(int32_t *)(this->super_MapValueConstRef).data_ = local_14;
  return;
}

Assistant:

void SetInt32Value(int32_t value) {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_INT32, "MapValueRef::SetInt32Value");
    *reinterpret_cast<int32_t*>(data_) = value;
  }